

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroup::QParallelAnimationGroup(QParallelAnimationGroup *this,QObject *parent)

{
  QAnimationGroupPrivate *dd;
  QParallelAnimationGroupPrivate *in_RDI;
  QAnimationGroup *in_stack_ffffffffffffffe0;
  
  dd = (QAnimationGroupPrivate *)operator_new(200);
  QParallelAnimationGroupPrivate::QParallelAnimationGroupPrivate(in_RDI);
  QAnimationGroup::QAnimationGroup(in_stack_ffffffffffffffe0,dd,(QObject *)in_RDI);
  (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate.
  super_QObjectData._vptr_QObjectData = (_func_int **)&PTR_metaObject_00be9a40;
  return;
}

Assistant:

QParallelAnimationGroup::QParallelAnimationGroup(QObject *parent)
    : QAnimationGroup(*new QParallelAnimationGroupPrivate, parent)
{
}